

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void fill_MPP_FMT_RGB444(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  byte bVar1;
  byte bVar2;
  RK_U16 val;
  RK_U32 be_local;
  RK_U32 B_local;
  RK_U32 G_local;
  RK_U32 R_local;
  RK_U8 *p_local;
  
  bVar1 = (byte)(R >> 4) & 0xf;
  bVar2 = (byte)((G >> 4 & 0xf) << 4) | (byte)(B >> 4) & 0xf;
  if (be == 0) {
    *p = bVar2;
    p[1] = bVar1;
  }
  else {
    *p = bVar1;
    p[1] = bVar2;
  }
  return;
}

Assistant:

static void fill_MPP_FMT_RGB444(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_RGB444 = ffmpeg: rgb444be
    // 16 bit pixel     MSB  -------->  LSB
    //                 (0000,rrrr,gggg,bbbb)
    // big    endian   |  byte 0 |  byte 1 |
    // little endian   |  byte 1 |  byte 0 |
    RK_U16 val = (((R >> 4) & 0xf) << 8) |
                 (((G >> 4) & 0xf) << 4) |
                 (((B >> 4) & 0xf) << 0);
    if (be) {
        p[0] = (val >> 8) & 0xff;
        p[1] = (val >> 0) & 0xff;
    } else {
        p[0] = (val >> 0) & 0xff;
        p[1] = (val >> 8) & 0xff;
    }
}